

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

const_iterator __thiscall
QHash<void_const_volatile*,void_const*>::constFindImpl<void_const_volatile*>
          (QHash<void_const_volatile*,void_const*> *this,void **key)

{
  Data<QHashPrivate::Node<void_const_volatile*,void_const*>> *this_00;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = *(Data<QHashPrivate::Node<void_const_volatile*,void_const*>> **)this;
  if ((this_00 != (Data<QHashPrivate::Node<void_const_volatile*,void_const*>> *)0x0) &&
     (*(long *)(this_00 + 8) != 0)) {
    uVar2 = ((*(ulong *)(this_00 + 0x18) ^ (ulong)*key) >> 0x20 ^
            *(ulong *)(this_00 + 0x18) ^ (ulong)*key) * -0x2917014799a6026d;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
            findBucketWithHash<void_const_volatile*>(this_00,key,uVar2 >> 0x20 ^ uVar2);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = *(Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> **)this;
      uVar2 = ((ulong)((long)BVar3.span - (long)pDVar1->spans) >> 4) * 0x1c71c71c71c71c80 |
              BVar3.index;
      goto LAB_0038968b;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)0x0;
LAB_0038968b:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }